

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbInternal.cpp
# Opt level: O0

void chatra::emb::writeRawInt
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,int64_t value)

{
  ulong local_38;
  byte local_2b;
  byte local_2a;
  uchar local_29;
  ulong local_28;
  uint64_t t;
  int64_t iStack_18;
  int sign;
  int64_t value_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_local;
  
  t._4_4_ = -1;
  if (-1 < value) {
    t._4_4_ = 1;
  }
  local_38 = value;
  if (t._4_4_ < 1) {
    local_38 = value ^ 0xffffffffffffffff;
  }
  local_28 = local_38;
  iStack_18 = value;
  value_local = (int64_t)buffer;
  if ((t._4_4_ < 1) || (0x7f < local_38)) {
    do {
      local_2a = (byte)local_28 & 0x7f | 0x80;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local,&local_2a);
      local_28 = local_28 >> 7;
    } while (0x3f < local_28);
    local_2b = 0x40;
    if (0 < t._4_4_) {
      local_2b = 0;
    }
    local_2b = (byte)local_28 | local_2b;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)value_local,&local_2b);
  }
  else {
    local_29 = (uchar)local_38;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (buffer,&local_29);
  }
  return;
}

Assistant:

void writeRawInt(std::vector<uint8_t> &buffer, int64_t value) {
	int sign = (value >= 0 ? 1 : -1);
	auto t = (sign > 0 ? static_cast<uint64_t>(value) : static_cast<uint64_t>(~value));
	if (sign > 0 && t < 128) {
		buffer.emplace_back(static_cast<uint8_t>(t));
		return;
	}
	for (;;) {
		buffer.emplace_back(static_cast<uint8_t>((t & 0x7FU) | 0x80U));
		t >>= 7U;
		if (t < 64) {
			buffer.emplace_back(static_cast<uint8_t>(t | (sign > 0 ? 0U : 0x40U)));
			break;
		}
	}
}